

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<8,_16781328,_true,_embree::avx::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  char cVar30;
  AABBNodeMB4D *node1;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  long lVar37;
  NodeRef *pNVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined4 uVar42;
  ulong unaff_R15;
  float fVar43;
  undefined1 auVar45 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar46 [32];
  float fVar51;
  undefined1 auVar44 [16];
  undefined1 auVar47 [32];
  float fVar52;
  undefined1 auVar48 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 extraout_var [56];
  float fVar60;
  float fVar65;
  float fVar66;
  undefined1 auVar61 [16];
  float fVar67;
  undefined1 auVar62 [16];
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar79;
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar83 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  float fVar87;
  float fVar88;
  float fVar92;
  float fVar93;
  vfloat4 a0;
  undefined1 auVar89 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar102;
  float fVar103;
  float fVar108;
  float fVar109;
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  float fVar110;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar117;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [32];
  undefined1 auVar125 [32];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  Precalculations pre;
  NodeRef stack [564];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar43 = ray->tfar, 0.0 <= fVar43)) {
    aVar7 = (ray->dir).field_0.field_1;
    auVar44 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    auVar61 = vrsqrtss_avx(auVar44,auVar44);
    fVar87 = auVar61._0_4_;
    fVar3 = (ray->dir).field_0.m128[0];
    fVar4 = (ray->dir).field_0.m128[1];
    pre.depth_scale = fVar87 * 1.5 - auVar44._0_4_ * 0.5 * fVar87 * fVar87 * fVar87;
    fVar87 = (ray->dir).field_0.m128[2];
    auVar71 = vshufps_avx(ZEXT416((uint)pre.depth_scale),ZEXT416((uint)pre.depth_scale),0);
    auVar89._0_4_ = aVar7.x * auVar71._0_4_;
    auVar89._4_4_ = aVar7.y * auVar71._4_4_;
    auVar89._8_4_ = aVar7.z * auVar71._8_4_;
    auVar89._12_4_ = aVar7.field_3.w * auVar71._12_4_;
    auVar61 = vshufpd_avx(auVar89,auVar89,1);
    auVar44 = vmovshdup_avx(auVar89);
    auVar115._8_4_ = 0x80000000;
    auVar115._0_8_ = 0x8000000080000000;
    auVar115._12_4_ = 0x80000000;
    auVar98._12_4_ = 0;
    auVar98._0_12_ = ZEXT812(0);
    auVar98 = auVar98 << 0x20;
    auVar111 = vunpckhps_avx(auVar89,auVar98);
    auVar80 = vshufps_avx(auVar111,ZEXT416(auVar44._0_4_ ^ 0x80000000),0x41);
    auVar111._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
    auVar111._8_8_ = auVar61._8_8_ ^ auVar115._8_8_;
    auVar111 = vinsertps_avx(auVar111,auVar89,0x2a);
    auVar44 = vdpps_avx(auVar80,auVar80,0x7f);
    auVar61 = vdpps_avx(auVar111,auVar111,0x7f);
    auVar44 = vcmpps_avx(auVar61,auVar44,1);
    auVar44 = vshufps_avx(auVar44,auVar44,0);
    auVar44 = vblendvps_avx(auVar111,auVar80,auVar44);
    auVar61 = vdpps_avx(auVar44,auVar44,0x7f);
    auVar111 = vrsqrtss_avx(auVar61,auVar61);
    fVar102 = auVar111._0_4_;
    auVar61 = ZEXT416((uint)(fVar102 * 1.5 - auVar61._0_4_ * 0.5 * fVar102 * fVar102 * fVar102));
    auVar61 = vshufps_avx(auVar61,auVar61,0);
    auVar104._0_4_ = auVar44._0_4_ * auVar61._0_4_;
    auVar104._4_4_ = auVar44._4_4_ * auVar61._4_4_;
    auVar104._8_4_ = auVar44._8_4_ * auVar61._8_4_;
    auVar104._12_4_ = auVar44._12_4_ * auVar61._12_4_;
    auVar44 = vshufps_avx(auVar104,auVar104,0xc9);
    auVar61 = vshufps_avx(auVar89,auVar89,0xc9);
    auVar116._0_4_ = auVar61._0_4_ * auVar104._0_4_;
    auVar116._4_4_ = auVar61._4_4_ * auVar104._4_4_;
    auVar116._8_4_ = auVar61._8_4_ * auVar104._8_4_;
    auVar116._12_4_ = auVar61._12_4_ * auVar104._12_4_;
    auVar112._0_4_ = auVar44._0_4_ * auVar89._0_4_;
    auVar112._4_4_ = auVar44._4_4_ * auVar89._4_4_;
    auVar112._8_4_ = auVar44._8_4_ * auVar89._8_4_;
    auVar112._12_4_ = auVar44._12_4_ * auVar89._12_4_;
    auVar44 = vsubps_avx(auVar112,auVar116);
    auVar111 = vshufps_avx(auVar44,auVar44,0xc9);
    auVar44 = vdpps_avx(auVar111,auVar111,0x7f);
    auVar61 = vrsqrtss_avx(auVar44,auVar44);
    fVar102 = auVar61._0_4_;
    auVar44 = ZEXT416((uint)(fVar102 * 1.5 - fVar102 * fVar102 * fVar102 * auVar44._0_4_ * 0.5));
    auVar44 = vshufps_avx(auVar44,auVar44,0);
    auVar61._0_4_ = auVar111._0_4_ * auVar44._0_4_;
    auVar61._4_4_ = auVar111._4_4_ * auVar44._4_4_;
    auVar61._8_4_ = auVar111._8_4_ * auVar44._8_4_;
    auVar61._12_4_ = auVar111._12_4_ * auVar44._12_4_;
    auVar44._0_4_ = auVar71._0_4_ * auVar89._0_4_;
    auVar44._4_4_ = auVar71._4_4_ * auVar89._4_4_;
    auVar44._8_4_ = auVar71._8_4_ * auVar89._8_4_;
    auVar44._12_4_ = auVar71._12_4_ * auVar89._12_4_;
    auVar111 = vunpcklps_avx(auVar104,auVar44);
    auVar44 = vunpckhps_avx(auVar104,auVar44);
    auVar71 = vunpcklps_avx(auVar61,auVar98);
    auVar61 = vunpckhps_avx(auVar61,auVar98);
    pre.ray_space.vz.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar44,auVar61)
    ;
    pre.ray_space.vx.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar111,auVar71);
    pre.ray_space.vy.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar111,auVar71);
    pNVar38 = stack + 1;
    auVar111 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    auVar71._8_4_ = 0x7fffffff;
    auVar71._0_8_ = 0x7fffffff7fffffff;
    auVar71._12_4_ = 0x7fffffff;
    auVar44 = vandps_avx((undefined1  [16])aVar7,auVar71);
    auVar80._8_4_ = 0x219392ef;
    auVar80._0_8_ = 0x219392ef219392ef;
    auVar80._12_4_ = 0x219392ef;
    auVar44 = vcmpps_avx(auVar44,auVar80,1);
    auVar81._8_4_ = 0x3f800000;
    auVar81._0_8_ = &DAT_3f8000003f800000;
    auVar81._12_4_ = 0x3f800000;
    auVar61 = vdivps_avx(auVar81,(undefined1  [16])aVar7);
    auVar82._8_4_ = 0x5d5e0b6b;
    auVar82._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar82._12_4_ = 0x5d5e0b6b;
    auVar44 = vblendvps_avx(auVar61,auVar82,auVar44);
    auVar72._0_4_ = auVar44._0_4_ * 0.99999964;
    auVar72._4_4_ = auVar44._4_4_ * 0.99999964;
    auVar72._8_4_ = auVar44._8_4_ * 0.99999964;
    auVar72._12_4_ = auVar44._12_4_ * 0.99999964;
    auVar53._0_4_ = auVar44._0_4_ * 1.0000004;
    auVar53._4_4_ = auVar44._4_4_ * 1.0000004;
    auVar53._8_4_ = auVar44._8_4_ * 1.0000004;
    auVar53._12_4_ = auVar44._12_4_ * 1.0000004;
    fVar102 = (ray->org).field_0.m128[0];
    auVar100._4_4_ = fVar102;
    auVar100._0_4_ = fVar102;
    auVar100._8_4_ = fVar102;
    auVar100._12_4_ = fVar102;
    auVar100._16_4_ = fVar102;
    auVar100._20_4_ = fVar102;
    auVar100._24_4_ = fVar102;
    auVar100._28_4_ = fVar102;
    fVar5 = (ray->org).field_0.m128[1];
    auVar105._4_4_ = fVar5;
    auVar105._0_4_ = fVar5;
    auVar105._8_4_ = fVar5;
    auVar105._12_4_ = fVar5;
    auVar105._16_4_ = fVar5;
    auVar105._20_4_ = fVar5;
    auVar105._24_4_ = fVar5;
    auVar105._28_4_ = fVar5;
    fVar6 = (ray->org).field_0.m128[2];
    auVar113._4_4_ = fVar6;
    auVar113._0_4_ = fVar6;
    auVar113._8_4_ = fVar6;
    auVar113._12_4_ = fVar6;
    auVar113._16_4_ = fVar6;
    auVar113._20_4_ = fVar6;
    auVar113._24_4_ = fVar6;
    auVar113._28_4_ = fVar6;
    auVar71 = vshufps_avx(auVar72,auVar72,0);
    auVar44 = vmovshdup_avx(auVar72);
    auVar86 = ZEXT1664(auVar44);
    auVar80 = vshufps_avx(auVar72,auVar72,0x55);
    auVar61 = vshufpd_avx(auVar72,auVar72,1);
    auVar98 = vshufps_avx(auVar72,auVar72,0xaa);
    auVar81 = vshufps_avx(auVar53,auVar53,0);
    auVar82 = vshufps_avx(auVar53,auVar53,0x55);
    auVar78 = ZEXT1664(auVar82);
    auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
    uVar39 = (ulong)(auVar72._0_4_ < 0.0) * 0x20;
    uVar40 = (ulong)(auVar44._0_4_ < 0.0) << 5 | 0x40;
    uVar41 = (ulong)(auVar61._0_4_ < 0.0) << 5 | 0x80;
    auVar44 = vshufps_avx(auVar111,auVar111,0);
    auVar59 = ZEXT1664(auVar44);
    auVar90._16_16_ = auVar44;
    auVar90._0_16_ = auVar44;
    auVar44 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
    auVar121._16_16_ = auVar44;
    auVar121._0_16_ = auVar44;
    do {
      if (pNVar38 == stack) {
        return;
      }
      uVar33 = pNVar38[-1].ptr;
      pNVar38 = pNVar38 + -1;
      do {
        if ((uVar33 & 8) == 0) {
          fVar43 = (ray->dir).field_0.m128[3];
          uVar34 = (uint)uVar33 & 7;
          uVar31 = uVar33 & 0xfffffffffffffff0;
          fVar117 = auVar71._12_4_;
          fVar88 = auVar82._12_4_;
          fVar60 = auVar81._12_4_;
          if (uVar34 == 3) {
            auVar44 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
            fVar43 = 1.0 - fVar43;
            auVar61 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
            fVar103 = auVar44._0_4_;
            fVar108 = auVar44._4_4_;
            fVar109 = auVar44._8_4_;
            fVar110 = auVar44._12_4_;
            auVar44 = vshufps_avx(ZEXT416((uint)(fVar43 * 0.0)),ZEXT416((uint)(fVar43 * 0.0)),0);
            fVar43 = auVar44._0_4_;
            fVar49 = auVar44._4_4_;
            fVar50 = auVar44._8_4_;
            fVar51 = auVar44._12_4_;
            auVar118._0_4_ = fVar103 * *(float *)(uVar31 + 0x200) + fVar43;
            auVar118._4_4_ = fVar108 * *(float *)(uVar31 + 0x204) + fVar49;
            auVar118._8_4_ = fVar109 * *(float *)(uVar31 + 0x208) + fVar50;
            auVar118._12_4_ = fVar110 * *(float *)(uVar31 + 0x20c) + fVar51;
            auVar118._16_4_ = fVar103 * *(float *)(uVar31 + 0x210) + fVar43;
            auVar118._20_4_ = fVar108 * *(float *)(uVar31 + 0x214) + fVar49;
            auVar118._24_4_ = fVar109 * *(float *)(uVar31 + 0x218) + fVar50;
            auVar118._28_4_ = auVar98._12_4_ + fVar51;
            fVar120 = auVar61._0_4_;
            fVar122 = auVar61._4_4_;
            fVar123 = auVar61._8_4_;
            fVar124 = auVar61._12_4_;
            auVar64._0_4_ =
                 *(float *)(uVar31 + 0x40) * fVar3 +
                 fVar4 * *(float *)(uVar31 + 0xa0) + *(float *)(uVar31 + 0x100) * fVar87;
            auVar64._4_4_ =
                 *(float *)(uVar31 + 0x44) * fVar3 +
                 fVar4 * *(float *)(uVar31 + 0xa4) + *(float *)(uVar31 + 0x104) * fVar87;
            auVar64._8_4_ =
                 *(float *)(uVar31 + 0x48) * fVar3 +
                 fVar4 * *(float *)(uVar31 + 0xa8) + *(float *)(uVar31 + 0x108) * fVar87;
            auVar64._12_4_ =
                 *(float *)(uVar31 + 0x4c) * fVar3 +
                 fVar4 * *(float *)(uVar31 + 0xac) + *(float *)(uVar31 + 0x10c) * fVar87;
            auVar64._16_4_ =
                 *(float *)(uVar31 + 0x50) * fVar3 +
                 fVar4 * *(float *)(uVar31 + 0xb0) + *(float *)(uVar31 + 0x110) * fVar87;
            auVar64._20_4_ =
                 *(float *)(uVar31 + 0x54) * fVar3 +
                 fVar4 * *(float *)(uVar31 + 0xb4) + *(float *)(uVar31 + 0x114) * fVar87;
            auVar64._24_4_ =
                 *(float *)(uVar31 + 0x58) * fVar3 +
                 fVar4 * *(float *)(uVar31 + 0xb8) + *(float *)(uVar31 + 0x118) * fVar87;
            auVar64._28_4_ = fVar60 + fVar88 + fVar51;
            auVar91._0_4_ =
                 *(float *)(uVar31 + 0xc0) * fVar4 + fVar87 * *(float *)(uVar31 + 0x120) +
                 *(float *)(uVar31 + 0x60) * fVar3;
            auVar91._4_4_ =
                 *(float *)(uVar31 + 0xc4) * fVar4 + fVar87 * *(float *)(uVar31 + 0x124) +
                 *(float *)(uVar31 + 100) * fVar3;
            auVar91._8_4_ =
                 *(float *)(uVar31 + 200) * fVar4 + fVar87 * *(float *)(uVar31 + 0x128) +
                 *(float *)(uVar31 + 0x68) * fVar3;
            auVar91._12_4_ =
                 *(float *)(uVar31 + 0xcc) * fVar4 + fVar87 * *(float *)(uVar31 + 300) +
                 *(float *)(uVar31 + 0x6c) * fVar3;
            auVar91._16_4_ =
                 *(float *)(uVar31 + 0xd0) * fVar4 + fVar87 * *(float *)(uVar31 + 0x130) +
                 *(float *)(uVar31 + 0x70) * fVar3;
            auVar91._20_4_ =
                 *(float *)(uVar31 + 0xd4) * fVar4 + fVar87 * *(float *)(uVar31 + 0x134) +
                 *(float *)(uVar31 + 0x74) * fVar3;
            auVar91._24_4_ =
                 *(float *)(uVar31 + 0xd8) * fVar4 + fVar87 * *(float *)(uVar31 + 0x138) +
                 *(float *)(uVar31 + 0x78) * fVar3;
            auVar91._28_4_ = fVar88 + fVar124 + 0.0;
            auVar106._0_4_ =
                 fVar4 * *(float *)(uVar31 + 0xe0) + fVar87 * *(float *)(uVar31 + 0x140) +
                 *(float *)(uVar31 + 0x80) * fVar3;
            auVar106._4_4_ =
                 fVar4 * *(float *)(uVar31 + 0xe4) + fVar87 * *(float *)(uVar31 + 0x144) +
                 *(float *)(uVar31 + 0x84) * fVar3;
            auVar106._8_4_ =
                 fVar4 * *(float *)(uVar31 + 0xe8) + fVar87 * *(float *)(uVar31 + 0x148) +
                 *(float *)(uVar31 + 0x88) * fVar3;
            auVar106._12_4_ =
                 fVar4 * *(float *)(uVar31 + 0xec) + fVar87 * *(float *)(uVar31 + 0x14c) +
                 *(float *)(uVar31 + 0x8c) * fVar3;
            auVar106._16_4_ =
                 fVar4 * *(float *)(uVar31 + 0xf0) + fVar87 * *(float *)(uVar31 + 0x150) +
                 *(float *)(uVar31 + 0x90) * fVar3;
            auVar106._20_4_ =
                 fVar4 * *(float *)(uVar31 + 0xf4) + fVar87 * *(float *)(uVar31 + 0x154) +
                 *(float *)(uVar31 + 0x94) * fVar3;
            auVar106._24_4_ =
                 fVar4 * *(float *)(uVar31 + 0xf8) + fVar87 * *(float *)(uVar31 + 0x158) +
                 *(float *)(uVar31 + 0x98) * fVar3;
            auVar106._28_4_ = fVar124 + fVar60 + fVar110;
            auVar47._8_4_ = 0x7fffffff;
            auVar47._0_8_ = 0x7fffffff7fffffff;
            auVar47._12_4_ = 0x7fffffff;
            auVar47._16_4_ = 0x7fffffff;
            auVar47._20_4_ = 0x7fffffff;
            auVar47._24_4_ = 0x7fffffff;
            auVar47._28_4_ = 0x7fffffff;
            auVar9 = vandps_avx(auVar64,auVar47);
            auVar56._8_4_ = 0x219392ef;
            auVar56._0_8_ = 0x219392ef219392ef;
            auVar56._12_4_ = 0x219392ef;
            auVar56._16_4_ = 0x219392ef;
            auVar56._20_4_ = 0x219392ef;
            auVar56._24_4_ = 0x219392ef;
            auVar56._28_4_ = 0x219392ef;
            auVar9 = vcmpps_avx(auVar9,auVar56,1);
            auVar48 = vblendvps_avx(auVar64,auVar56,auVar9);
            auVar9 = vandps_avx(auVar91,auVar47);
            auVar9 = vcmpps_avx(auVar9,auVar56,1);
            auVar10 = vblendvps_avx(auVar91,auVar56,auVar9);
            auVar9 = vandps_avx(auVar106,auVar47);
            auVar9 = vcmpps_avx(auVar9,auVar56,1);
            auVar9 = vblendvps_avx(auVar106,auVar56,auVar9);
            auVar8 = vrcpps_avx(auVar48);
            fVar126 = auVar8._0_4_;
            fVar127 = auVar8._4_4_;
            auVar11._4_4_ = fVar127 * auVar48._4_4_;
            auVar11._0_4_ = fVar126 * auVar48._0_4_;
            fVar128 = auVar8._8_4_;
            auVar11._8_4_ = fVar128 * auVar48._8_4_;
            fVar129 = auVar8._12_4_;
            auVar11._12_4_ = fVar129 * auVar48._12_4_;
            fVar130 = auVar8._16_4_;
            auVar11._16_4_ = fVar130 * auVar48._16_4_;
            fVar131 = auVar8._20_4_;
            auVar11._20_4_ = fVar131 * auVar48._20_4_;
            fVar132 = auVar8._24_4_;
            auVar11._24_4_ = fVar132 * auVar48._24_4_;
            auVar11._28_4_ = auVar48._28_4_;
            auVar57._8_4_ = 0x3f800000;
            auVar57._0_8_ = &DAT_3f8000003f800000;
            auVar57._12_4_ = 0x3f800000;
            auVar57._16_4_ = 0x3f800000;
            auVar57._20_4_ = 0x3f800000;
            auVar57._24_4_ = 0x3f800000;
            auVar57._28_4_ = 0x3f800000;
            auVar8 = vsubps_avx(auVar57,auVar11);
            auVar48 = vrcpps_avx(auVar10);
            fVar126 = fVar126 + fVar126 * auVar8._0_4_;
            fVar127 = fVar127 + fVar127 * auVar8._4_4_;
            fVar128 = fVar128 + fVar128 * auVar8._8_4_;
            fVar129 = fVar129 + fVar129 * auVar8._12_4_;
            fVar130 = fVar130 + fVar130 * auVar8._16_4_;
            fVar131 = fVar131 + fVar131 * auVar8._20_4_;
            fVar132 = fVar132 + fVar132 * auVar8._24_4_;
            fVar60 = auVar48._0_4_;
            fVar65 = auVar48._4_4_;
            auVar18._4_4_ = auVar10._4_4_ * fVar65;
            auVar18._0_4_ = auVar10._0_4_ * fVar60;
            fVar66 = auVar48._8_4_;
            auVar18._8_4_ = auVar10._8_4_ * fVar66;
            fVar67 = auVar48._12_4_;
            auVar18._12_4_ = auVar10._12_4_ * fVar67;
            fVar68 = auVar48._16_4_;
            auVar18._16_4_ = auVar10._16_4_ * fVar68;
            fVar69 = auVar48._20_4_;
            auVar18._20_4_ = auVar10._20_4_ * fVar69;
            fVar70 = auVar48._24_4_;
            auVar18._24_4_ = auVar10._24_4_ * fVar70;
            auVar18._28_4_ = auVar8._28_4_;
            auVar8 = vsubps_avx(auVar57,auVar18);
            auVar10 = vrcpps_avx(auVar9);
            fVar60 = fVar60 + fVar60 * auVar8._0_4_;
            fVar65 = fVar65 + fVar65 * auVar8._4_4_;
            fVar66 = fVar66 + fVar66 * auVar8._8_4_;
            fVar67 = fVar67 + fVar67 * auVar8._12_4_;
            fVar68 = fVar68 + fVar68 * auVar8._16_4_;
            fVar69 = fVar69 + fVar69 * auVar8._20_4_;
            fVar70 = fVar70 + fVar70 * auVar8._24_4_;
            fVar88 = auVar10._0_4_;
            fVar92 = auVar10._4_4_;
            auVar19._4_4_ = auVar9._4_4_ * fVar92;
            auVar19._0_4_ = auVar9._0_4_ * fVar88;
            fVar93 = auVar10._8_4_;
            auVar19._8_4_ = auVar9._8_4_ * fVar93;
            fVar94 = auVar10._12_4_;
            auVar19._12_4_ = auVar9._12_4_ * fVar94;
            fVar95 = auVar10._16_4_;
            auVar19._16_4_ = auVar9._16_4_ * fVar95;
            fVar96 = auVar10._20_4_;
            auVar19._20_4_ = auVar9._20_4_ * fVar96;
            fVar97 = auVar10._24_4_;
            auVar19._24_4_ = auVar9._24_4_ * fVar97;
            auVar19._28_4_ = auVar48._28_4_;
            auVar9 = vsubps_avx(auVar57,auVar19);
            fVar88 = fVar88 + fVar88 * auVar9._0_4_;
            fVar92 = fVar92 + fVar92 * auVar9._4_4_;
            fVar93 = fVar93 + fVar93 * auVar9._8_4_;
            fVar94 = fVar94 + fVar94 * auVar9._12_4_;
            fVar95 = fVar95 + fVar95 * auVar9._16_4_;
            fVar96 = fVar96 + fVar96 * auVar9._20_4_;
            fVar97 = fVar97 + fVar97 * auVar9._24_4_;
            fVar52 = auVar9._28_4_ + *(float *)(uVar31 + 0x17c) + 1.0;
            fVar79 = *(float *)(uVar31 + 0xbc) +
                     *(float *)(uVar31 + 0x15c) + *(float *)(uVar31 + 0x1bc);
            auVar85._0_4_ =
                 *(float *)(uVar31 + 0x40) * fVar102 +
                 *(float *)(uVar31 + 0xa0) * fVar5 +
                 *(float *)(uVar31 + 0x100) * fVar6 + *(float *)(uVar31 + 0x160);
            auVar85._4_4_ =
                 *(float *)(uVar31 + 0x44) * fVar102 +
                 *(float *)(uVar31 + 0xa4) * fVar5 +
                 *(float *)(uVar31 + 0x104) * fVar6 + *(float *)(uVar31 + 0x164);
            auVar85._8_4_ =
                 *(float *)(uVar31 + 0x48) * fVar102 +
                 *(float *)(uVar31 + 0xa8) * fVar5 +
                 *(float *)(uVar31 + 0x108) * fVar6 + *(float *)(uVar31 + 0x168);
            auVar85._12_4_ =
                 *(float *)(uVar31 + 0x4c) * fVar102 +
                 *(float *)(uVar31 + 0xac) * fVar5 +
                 *(float *)(uVar31 + 0x10c) * fVar6 + *(float *)(uVar31 + 0x16c);
            auVar85._16_4_ =
                 *(float *)(uVar31 + 0x50) * fVar102 +
                 *(float *)(uVar31 + 0xb0) * fVar5 +
                 *(float *)(uVar31 + 0x110) * fVar6 + *(float *)(uVar31 + 0x170);
            auVar85._20_4_ =
                 *(float *)(uVar31 + 0x54) * fVar102 +
                 *(float *)(uVar31 + 0xb4) * fVar5 +
                 *(float *)(uVar31 + 0x114) * fVar6 + *(float *)(uVar31 + 0x174);
            auVar85._24_4_ =
                 *(float *)(uVar31 + 0x58) * fVar102 +
                 *(float *)(uVar31 + 0xb8) * fVar5 +
                 *(float *)(uVar31 + 0x118) * fVar6 + *(float *)(uVar31 + 0x178);
            auVar85._28_4_ = *(float *)(uVar31 + 0xbc) + fVar52;
            auVar101._0_4_ =
                 *(float *)(uVar31 + 0x60) * fVar102 +
                 *(float *)(uVar31 + 0xc0) * fVar5 +
                 *(float *)(uVar31 + 0x120) * fVar6 + *(float *)(uVar31 + 0x180);
            auVar101._4_4_ =
                 *(float *)(uVar31 + 100) * fVar102 +
                 *(float *)(uVar31 + 0xc4) * fVar5 +
                 *(float *)(uVar31 + 0x124) * fVar6 + *(float *)(uVar31 + 0x184);
            auVar101._8_4_ =
                 *(float *)(uVar31 + 0x68) * fVar102 +
                 *(float *)(uVar31 + 200) * fVar5 +
                 *(float *)(uVar31 + 0x128) * fVar6 + *(float *)(uVar31 + 0x188);
            auVar101._12_4_ =
                 *(float *)(uVar31 + 0x6c) * fVar102 +
                 *(float *)(uVar31 + 0xcc) * fVar5 +
                 *(float *)(uVar31 + 300) * fVar6 + *(float *)(uVar31 + 0x18c);
            auVar101._16_4_ =
                 *(float *)(uVar31 + 0x70) * fVar102 +
                 *(float *)(uVar31 + 0xd0) * fVar5 +
                 *(float *)(uVar31 + 0x130) * fVar6 + *(float *)(uVar31 + 400);
            auVar101._20_4_ =
                 *(float *)(uVar31 + 0x74) * fVar102 +
                 *(float *)(uVar31 + 0xd4) * fVar5 +
                 *(float *)(uVar31 + 0x134) * fVar6 + *(float *)(uVar31 + 0x194);
            auVar101._24_4_ =
                 *(float *)(uVar31 + 0x78) * fVar102 +
                 *(float *)(uVar31 + 0xd8) * fVar5 +
                 *(float *)(uVar31 + 0x138) * fVar6 + *(float *)(uVar31 + 0x198);
            auVar101._28_4_ = fVar52 + *(float *)(uVar31 + 0x13c) + *(float *)(uVar31 + 0x19c) + 1.0
            ;
            auVar107._0_4_ =
                 *(float *)(uVar31 + 0x80) * fVar102 +
                 *(float *)(uVar31 + 0xe0) * fVar5 +
                 *(float *)(uVar31 + 0x140) * fVar6 + *(float *)(uVar31 + 0x1a0);
            auVar107._4_4_ =
                 *(float *)(uVar31 + 0x84) * fVar102 +
                 *(float *)(uVar31 + 0xe4) * fVar5 +
                 *(float *)(uVar31 + 0x144) * fVar6 + *(float *)(uVar31 + 0x1a4);
            auVar107._8_4_ =
                 *(float *)(uVar31 + 0x88) * fVar102 +
                 *(float *)(uVar31 + 0xe8) * fVar5 +
                 *(float *)(uVar31 + 0x148) * fVar6 + *(float *)(uVar31 + 0x1a8);
            auVar107._12_4_ =
                 *(float *)(uVar31 + 0x8c) * fVar102 +
                 *(float *)(uVar31 + 0xec) * fVar5 +
                 *(float *)(uVar31 + 0x14c) * fVar6 + *(float *)(uVar31 + 0x1ac);
            auVar107._16_4_ =
                 *(float *)(uVar31 + 0x90) * fVar102 +
                 *(float *)(uVar31 + 0xf0) * fVar5 +
                 *(float *)(uVar31 + 0x150) * fVar6 + *(float *)(uVar31 + 0x1b0);
            auVar107._20_4_ =
                 *(float *)(uVar31 + 0x94) * fVar102 +
                 *(float *)(uVar31 + 0xf4) * fVar5 +
                 *(float *)(uVar31 + 0x154) * fVar6 + *(float *)(uVar31 + 0x1b4);
            auVar107._24_4_ =
                 *(float *)(uVar31 + 0x98) * fVar102 +
                 *(float *)(uVar31 + 0xf8) * fVar5 +
                 *(float *)(uVar31 + 0x158) * fVar6 + *(float *)(uVar31 + 0x1b8);
            auVar107._28_4_ = fVar52 + fVar79;
            auVar25._4_4_ = fVar108 * *(float *)(uVar31 + 0x1c4) + fVar49;
            auVar25._0_4_ = fVar103 * *(float *)(uVar31 + 0x1c0) + fVar43;
            auVar25._8_4_ = fVar109 * *(float *)(uVar31 + 0x1c8) + fVar50;
            auVar25._12_4_ = fVar110 * *(float *)(uVar31 + 0x1cc) + fVar51;
            auVar25._16_4_ = fVar103 * *(float *)(uVar31 + 0x1d0) + fVar43;
            auVar25._20_4_ = fVar108 * *(float *)(uVar31 + 0x1d4) + fVar49;
            auVar25._24_4_ = fVar109 * *(float *)(uVar31 + 0x1d8) + fVar50;
            auVar25._28_4_ = fVar6 + fVar51;
            auVar9 = vsubps_avx(auVar25,auVar85);
            auVar29._4_4_ = fVar108 * *(float *)(uVar31 + 0x1e4) + fVar49;
            auVar29._0_4_ = fVar103 * *(float *)(uVar31 + 0x1e0) + fVar43;
            auVar29._8_4_ = fVar109 * *(float *)(uVar31 + 0x1e8) + fVar50;
            auVar29._12_4_ = fVar110 * *(float *)(uVar31 + 0x1ec) + fVar51;
            auVar29._16_4_ = fVar103 * *(float *)(uVar31 + 0x1f0) + fVar43;
            auVar29._20_4_ = fVar108 * *(float *)(uVar31 + 500) + fVar49;
            auVar29._24_4_ = fVar109 * *(float *)(uVar31 + 0x1f8) + fVar50;
            auVar29._28_4_ = fVar117 + fVar51;
            auVar10 = vsubps_avx(auVar29,auVar101);
            auVar11 = vsubps_avx(auVar118,auVar107);
            auVar73._0_4_ = fVar126 * auVar9._0_4_;
            auVar73._4_4_ = fVar127 * auVar9._4_4_;
            auVar73._8_4_ = fVar128 * auVar9._8_4_;
            auVar73._12_4_ = fVar129 * auVar9._12_4_;
            auVar20._16_4_ = fVar130 * auVar9._16_4_;
            auVar20._0_16_ = auVar73;
            auVar20._20_4_ = fVar131 * auVar9._20_4_;
            auVar20._24_4_ = fVar132 * auVar9._24_4_;
            auVar20._28_4_ = fVar79;
            auVar54._0_4_ = auVar10._0_4_ * fVar60;
            auVar54._4_4_ = auVar10._4_4_ * fVar65;
            auVar54._8_4_ = auVar10._8_4_ * fVar66;
            auVar54._12_4_ = auVar10._12_4_ * fVar67;
            auVar21._16_4_ = auVar10._16_4_ * fVar68;
            auVar21._0_16_ = auVar54;
            auVar21._20_4_ = auVar10._20_4_ * fVar69;
            auVar21._24_4_ = auVar10._24_4_ * fVar70;
            auVar21._28_4_ = auVar10._28_4_;
            auVar45._0_4_ = auVar11._0_4_ * fVar88;
            auVar45._4_4_ = auVar11._4_4_ * fVar92;
            auVar45._8_4_ = auVar11._8_4_ * fVar93;
            auVar45._12_4_ = auVar11._12_4_ * fVar94;
            auVar22._16_4_ = auVar11._16_4_ * fVar95;
            auVar22._0_16_ = auVar45;
            auVar22._20_4_ = auVar11._20_4_ * fVar96;
            auVar22._24_4_ = auVar11._24_4_ * fVar97;
            auVar22._28_4_ = auVar9._28_4_;
            auVar28._4_4_ = fVar122 + fVar108 * *(float *)(uVar31 + 0x224);
            auVar28._0_4_ = fVar120 + fVar103 * *(float *)(uVar31 + 0x220);
            auVar28._8_4_ = fVar123 + fVar109 * *(float *)(uVar31 + 0x228);
            auVar28._12_4_ = fVar124 + fVar110 * *(float *)(uVar31 + 0x22c);
            auVar28._16_4_ = fVar120 + fVar103 * *(float *)(uVar31 + 0x230);
            auVar28._20_4_ = fVar122 + fVar108 * *(float *)(uVar31 + 0x234);
            auVar28._24_4_ = fVar123 + fVar109 * *(float *)(uVar31 + 0x238);
            auVar28._28_4_ = fVar124 + fVar6;
            auVar9 = vsubps_avx(auVar28,auVar85);
            auVar27._4_4_ = fVar122 + fVar108 * *(float *)(uVar31 + 0x244);
            auVar27._0_4_ = fVar120 + fVar103 * *(float *)(uVar31 + 0x240);
            auVar27._8_4_ = fVar123 + fVar109 * *(float *)(uVar31 + 0x248);
            auVar27._12_4_ = fVar124 + fVar110 * *(float *)(uVar31 + 0x24c);
            auVar27._16_4_ = fVar120 + fVar103 * *(float *)(uVar31 + 0x250);
            auVar27._20_4_ = fVar122 + fVar108 * *(float *)(uVar31 + 0x254);
            auVar27._24_4_ = fVar123 + fVar109 * *(float *)(uVar31 + 600);
            auVar27._28_4_ = fVar124 + fVar117;
            auVar10 = vsubps_avx(auVar27,auVar101);
            auVar26._4_4_ = fVar122 + fVar108 * *(float *)(uVar31 + 0x264);
            auVar26._0_4_ = fVar120 + fVar103 * *(float *)(uVar31 + 0x260);
            auVar26._8_4_ = fVar123 + fVar109 * *(float *)(uVar31 + 0x268);
            auVar26._12_4_ = fVar124 + fVar110 * *(float *)(uVar31 + 0x26c);
            auVar26._16_4_ = fVar120 + fVar103 * *(float *)(uVar31 + 0x270);
            auVar26._20_4_ = fVar122 + fVar108 * *(float *)(uVar31 + 0x274);
            auVar26._24_4_ = fVar123 + fVar109 * *(float *)(uVar31 + 0x278);
            auVar26._28_4_ = fVar124 + fVar51;
            auVar11 = vsubps_avx(auVar26,auVar107);
            auVar83._0_4_ = fVar126 * auVar9._0_4_;
            auVar83._4_4_ = fVar127 * auVar9._4_4_;
            auVar83._8_4_ = fVar128 * auVar9._8_4_;
            auVar83._12_4_ = fVar129 * auVar9._12_4_;
            auVar23._16_4_ = fVar130 * auVar9._16_4_;
            auVar23._0_16_ = auVar83;
            auVar23._20_4_ = fVar131 * auVar9._20_4_;
            auVar23._24_4_ = fVar132 * auVar9._24_4_;
            auVar23._28_4_ = auVar9._28_4_;
            auVar99._0_4_ = auVar10._0_4_ * fVar60;
            auVar99._4_4_ = auVar10._4_4_ * fVar65;
            auVar99._8_4_ = auVar10._8_4_ * fVar66;
            auVar99._12_4_ = auVar10._12_4_ * fVar67;
            auVar24._16_4_ = auVar10._16_4_ * fVar68;
            auVar24._0_16_ = auVar99;
            auVar24._20_4_ = auVar10._20_4_ * fVar69;
            auVar24._24_4_ = auVar10._24_4_ * fVar70;
            auVar24._28_4_ = auVar10._28_4_;
            auVar62._0_4_ = auVar11._0_4_ * fVar88;
            auVar62._4_4_ = auVar11._4_4_ * fVar92;
            auVar62._8_4_ = auVar11._8_4_ * fVar93;
            auVar62._12_4_ = auVar11._12_4_ * fVar94;
            auVar10._16_4_ = auVar11._16_4_ * fVar95;
            auVar10._0_16_ = auVar62;
            auVar10._20_4_ = auVar11._20_4_ * fVar96;
            auVar10._24_4_ = auVar11._24_4_ * fVar97;
            auVar10._28_4_ = auVar48._28_4_ + auVar8._28_4_;
            auVar44 = vpminsd_avx(auVar20._16_16_,auVar23._16_16_);
            auVar61 = vpminsd_avx(auVar73,auVar83);
            auVar114._16_16_ = auVar44;
            auVar114._0_16_ = auVar61;
            auVar44 = vpminsd_avx(auVar21._16_16_,auVar24._16_16_);
            auVar61 = vpminsd_avx(auVar54,auVar99);
            auVar119._16_16_ = auVar44;
            auVar119._0_16_ = auVar61;
            auVar44 = vpminsd_avx(auVar22._16_16_,auVar10._16_16_);
            auVar61 = vpminsd_avx(auVar45,auVar62);
            auVar125._16_16_ = auVar44;
            auVar125._0_16_ = auVar61;
            auVar9 = vmaxps_avx(auVar119,auVar125);
            auVar44 = vpmaxsd_avx(auVar20._16_16_,auVar23._16_16_);
            auVar61 = vpmaxsd_avx(auVar73,auVar83);
            auVar77._16_16_ = auVar44;
            auVar77._0_16_ = auVar61;
            auVar78 = ZEXT3264(auVar77);
            auVar44 = vpmaxsd_avx(auVar21._16_16_,auVar24._16_16_);
            auVar61 = vpmaxsd_avx(auVar54,auVar99);
            auVar58._16_16_ = auVar44;
            auVar58._0_16_ = auVar61;
            auVar44 = vpmaxsd_avx(auVar22._16_16_,auVar10._16_16_);
            auVar86 = ZEXT1664(auVar44);
            auVar61 = vpmaxsd_avx(auVar45,auVar62);
            auVar48._16_16_ = auVar44;
            auVar48._0_16_ = auVar61;
            auVar10 = vminps_avx(auVar58,auVar48);
            auVar48 = vmaxps_avx(auVar90,auVar114);
            auVar9 = vmaxps_avx(auVar48,auVar9);
            auVar48 = vminps_avx(auVar121,auVar77);
            auVar48 = vminps_avx(auVar48,auVar10);
            auVar8._4_4_ = auVar9._4_4_ * 0.99999964;
            auVar8._0_4_ = auVar9._0_4_ * 0.99999964;
            auVar8._8_4_ = auVar9._8_4_ * 0.99999964;
            auVar8._12_4_ = auVar9._12_4_ * 0.99999964;
            auVar8._16_4_ = auVar9._16_4_ * 0.99999964;
            auVar8._20_4_ = auVar9._20_4_ * 0.99999964;
            auVar8._24_4_ = auVar9._24_4_ * 0.99999964;
            auVar8._28_4_ = auVar9._28_4_;
            auVar59 = ZEXT3264(auVar8);
            auVar9._4_4_ = auVar48._4_4_ * 1.0000004;
            auVar9._0_4_ = auVar48._0_4_ * 1.0000004;
            auVar9._8_4_ = auVar48._8_4_ * 1.0000004;
            auVar9._12_4_ = auVar48._12_4_ * 1.0000004;
            auVar9._16_4_ = auVar48._16_4_ * 1.0000004;
            auVar9._20_4_ = auVar48._20_4_ * 1.0000004;
            auVar9._24_4_ = auVar48._24_4_ * 1.0000004;
            auVar9._28_4_ = auVar48._28_4_;
            auVar9 = vcmpps_avx(auVar8,auVar9,2);
            uVar42 = vmovmskps_avx(auVar9);
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar42);
          }
          else {
            auVar44 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
            auVar46._16_16_ = auVar44;
            auVar46._0_16_ = auVar44;
            pfVar2 = (float *)(uVar31 + 0x100 + uVar39);
            fVar43 = auVar44._0_4_;
            fVar49 = auVar44._4_4_;
            fVar50 = auVar44._8_4_;
            fVar51 = auVar44._12_4_;
            pfVar1 = (float *)(uVar31 + 0x40 + uVar39);
            auVar55._0_4_ = fVar43 * *pfVar2 + *pfVar1;
            auVar55._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar55._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
            auVar55._12_4_ = fVar51 * pfVar2[3] + pfVar1[3];
            auVar55._16_4_ = fVar43 * pfVar2[4] + pfVar1[4];
            auVar55._20_4_ = fVar49 * pfVar2[5] + pfVar1[5];
            auVar55._24_4_ = fVar50 * pfVar2[6] + pfVar1[6];
            auVar55._28_4_ = auVar59._28_4_ + pfVar1[7];
            auVar9 = vsubps_avx(auVar55,auVar100);
            auVar12._4_4_ = auVar71._4_4_ * auVar9._4_4_;
            auVar12._0_4_ = auVar71._0_4_ * auVar9._0_4_;
            auVar12._8_4_ = auVar71._8_4_ * auVar9._8_4_;
            auVar12._12_4_ = fVar117 * auVar9._12_4_;
            auVar12._16_4_ = auVar71._0_4_ * auVar9._16_4_;
            auVar12._20_4_ = auVar71._4_4_ * auVar9._20_4_;
            auVar12._24_4_ = auVar71._8_4_ * auVar9._24_4_;
            auVar12._28_4_ = auVar9._28_4_;
            pfVar2 = (float *)(uVar31 + 0x100 + uVar40);
            pfVar1 = (float *)(uVar31 + 0x40 + uVar40);
            auVar63._0_4_ = fVar43 * *pfVar2 + *pfVar1;
            auVar63._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar63._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
            auVar63._12_4_ = fVar51 * pfVar2[3] + pfVar1[3];
            auVar63._16_4_ = fVar43 * pfVar2[4] + pfVar1[4];
            auVar63._20_4_ = fVar49 * pfVar2[5] + pfVar1[5];
            auVar63._24_4_ = fVar50 * pfVar2[6] + pfVar1[6];
            auVar63._28_4_ = pfVar1[7] + 0.0;
            auVar9 = vsubps_avx(auVar63,auVar105);
            auVar13._4_4_ = auVar80._4_4_ * auVar9._4_4_;
            auVar13._0_4_ = auVar80._0_4_ * auVar9._0_4_;
            auVar13._8_4_ = auVar80._8_4_ * auVar9._8_4_;
            auVar13._12_4_ = auVar80._12_4_ * auVar9._12_4_;
            auVar13._16_4_ = auVar80._0_4_ * auVar9._16_4_;
            auVar13._20_4_ = auVar80._4_4_ * auVar9._20_4_;
            auVar13._24_4_ = auVar80._8_4_ * auVar9._24_4_;
            auVar13._28_4_ = auVar9._28_4_;
            pfVar2 = (float *)(uVar31 + 0x100 + uVar41);
            pfVar1 = (float *)(uVar31 + 0x40 + uVar41);
            auVar74._0_4_ = fVar43 * *pfVar2 + *pfVar1;
            auVar74._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar74._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
            auVar74._12_4_ = fVar51 * pfVar2[3] + pfVar1[3];
            auVar74._16_4_ = fVar43 * pfVar2[4] + pfVar1[4];
            auVar74._20_4_ = fVar49 * pfVar2[5] + pfVar1[5];
            auVar74._24_4_ = fVar50 * pfVar2[6] + pfVar1[6];
            auVar74._28_4_ = auVar78._28_4_ + pfVar1[7];
            auVar10 = vsubps_avx(auVar74,auVar113);
            auVar14._4_4_ = auVar98._4_4_ * auVar10._4_4_;
            auVar14._0_4_ = auVar98._0_4_ * auVar10._0_4_;
            auVar14._8_4_ = auVar98._8_4_ * auVar10._8_4_;
            auVar14._12_4_ = auVar98._12_4_ * auVar10._12_4_;
            auVar14._16_4_ = auVar98._0_4_ * auVar10._16_4_;
            auVar14._20_4_ = auVar98._4_4_ * auVar10._20_4_;
            auVar14._24_4_ = auVar98._8_4_ * auVar10._24_4_;
            auVar14._28_4_ = auVar10._28_4_;
            auVar9 = vmaxps_avx(auVar13,auVar14);
            auVar48 = vmaxps_avx(auVar90,auVar12);
            pfVar2 = (float *)(uVar31 + 0x100 + (uVar39 ^ 0x20));
            pfVar1 = (float *)(uVar31 + 0x40 + (uVar39 ^ 0x20));
            auVar75._0_4_ = fVar43 * *pfVar2 + *pfVar1;
            auVar75._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar75._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
            auVar75._12_4_ = fVar51 * pfVar2[3] + pfVar1[3];
            auVar75._16_4_ = fVar43 * pfVar2[4] + pfVar1[4];
            auVar75._20_4_ = fVar49 * pfVar2[5] + pfVar1[5];
            auVar75._24_4_ = fVar50 * pfVar2[6] + pfVar1[6];
            auVar75._28_4_ = auVar10._28_4_ + pfVar1[7];
            auVar9 = vmaxps_avx(auVar48,auVar9);
            auVar48 = vsubps_avx(auVar75,auVar100);
            pfVar2 = (float *)(uVar31 + 0x100 + (uVar40 ^ 0x20));
            auVar15._4_4_ = auVar81._4_4_ * auVar48._4_4_;
            auVar15._0_4_ = auVar81._0_4_ * auVar48._0_4_;
            auVar15._8_4_ = auVar81._8_4_ * auVar48._8_4_;
            auVar15._12_4_ = fVar60 * auVar48._12_4_;
            auVar15._16_4_ = auVar81._0_4_ * auVar48._16_4_;
            auVar15._20_4_ = auVar81._4_4_ * auVar48._20_4_;
            auVar15._24_4_ = auVar81._8_4_ * auVar48._24_4_;
            auVar15._28_4_ = auVar48._28_4_;
            pfVar1 = (float *)(uVar31 + 0x40 + (uVar40 ^ 0x20));
            auVar76._0_4_ = fVar43 * *pfVar2 + *pfVar1;
            auVar76._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar76._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
            auVar76._12_4_ = fVar51 * pfVar2[3] + pfVar1[3];
            auVar76._16_4_ = fVar43 * pfVar2[4] + pfVar1[4];
            auVar76._20_4_ = fVar49 * pfVar2[5] + pfVar1[5];
            auVar76._24_4_ = fVar50 * pfVar2[6] + pfVar1[6];
            auVar76._28_4_ = auVar75._28_4_ + pfVar1[7];
            auVar48 = vsubps_avx(auVar76,auVar105);
            pfVar2 = (float *)(uVar31 + 0x100 + (uVar41 ^ 0x20));
            pfVar1 = (float *)(uVar31 + 0x40 + (uVar41 ^ 0x20));
            auVar84._0_4_ = fVar43 * *pfVar2 + *pfVar1;
            auVar84._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar84._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
            auVar84._12_4_ = fVar51 * pfVar2[3] + pfVar1[3];
            auVar84._16_4_ = fVar43 * pfVar2[4] + pfVar1[4];
            auVar84._20_4_ = fVar49 * pfVar2[5] + pfVar1[5];
            auVar84._24_4_ = fVar50 * pfVar2[6] + pfVar1[6];
            auVar84._28_4_ = auVar86._28_4_ + pfVar1[7];
            auVar16._4_4_ = auVar82._4_4_ * auVar48._4_4_;
            auVar16._0_4_ = auVar82._0_4_ * auVar48._0_4_;
            auVar16._8_4_ = auVar82._8_4_ * auVar48._8_4_;
            auVar16._12_4_ = fVar88 * auVar48._12_4_;
            auVar16._16_4_ = auVar82._0_4_ * auVar48._16_4_;
            auVar16._20_4_ = auVar82._4_4_ * auVar48._20_4_;
            auVar16._24_4_ = auVar82._8_4_ * auVar48._24_4_;
            auVar16._28_4_ = auVar48._28_4_;
            auVar48 = vsubps_avx(auVar84,auVar113);
            auVar17._4_4_ = auVar53._4_4_ * auVar48._4_4_;
            auVar17._0_4_ = auVar53._0_4_ * auVar48._0_4_;
            auVar17._8_4_ = auVar53._8_4_ * auVar48._8_4_;
            auVar17._12_4_ = auVar53._12_4_ * auVar48._12_4_;
            auVar17._16_4_ = auVar53._0_4_ * auVar48._16_4_;
            auVar17._20_4_ = auVar53._4_4_ * auVar48._20_4_;
            auVar17._24_4_ = auVar53._8_4_ * auVar48._24_4_;
            auVar17._28_4_ = auVar48._28_4_;
            auVar86 = ZEXT3264(auVar17);
            auVar48 = vminps_avx(auVar16,auVar17);
            auVar78 = ZEXT3264(auVar48);
            auVar10 = vminps_avx(auVar121,auVar15);
            auVar48 = vminps_avx(auVar10,auVar48);
            auVar9 = vcmpps_avx(auVar9,auVar48,2);
            auVar59 = ZEXT3264(auVar9);
            if (uVar34 == 6) {
              auVar48 = vcmpps_avx(*(undefined1 (*) [32])(uVar31 + 0x1c0),auVar46,2);
              auVar10 = vcmpps_avx(auVar46,*(undefined1 (*) [32])(uVar31 + 0x1e0),1);
              auVar48 = vandps_avx(auVar48,auVar10);
              auVar9 = vandps_avx(auVar48,auVar9);
              auVar59 = ZEXT1664(auVar9._16_16_);
              auVar44 = vpackssdw_avx(auVar9._0_16_,auVar9._16_16_);
            }
            else {
              auVar44 = vpackssdw_avx(auVar9._0_16_,auVar9._16_16_);
            }
            auVar44 = vpsllw_avx(auVar44,0xf);
            auVar44 = vpacksswb_avx(auVar44,auVar44);
            unaff_R15 = (ulong)(byte)(SUB161(auVar44 >> 7,0) & 1 |
                                      (SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar44 >> 0x3f,0) << 7);
          }
        }
        if ((uVar33 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar35 = 4;
          }
          else {
            uVar31 = uVar33 & 0xfffffffffffffff0;
            lVar37 = 0;
            if (unaff_R15 != 0) {
              for (; (unaff_R15 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            iVar35 = 0;
            uVar33 = *(ulong *)(uVar31 + lVar37 * 8);
            uVar36 = unaff_R15 - 1 & unaff_R15;
            if (uVar36 != 0) {
              pNVar38->ptr = uVar33;
              lVar37 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                }
              }
              uVar32 = uVar36 - 1;
              while( true ) {
                pNVar38 = pNVar38 + 1;
                uVar33 = *(ulong *)(uVar31 + lVar37 * 8);
                uVar32 = uVar32 & uVar36;
                if (uVar32 == 0) break;
                pNVar38->ptr = uVar33;
                lVar37 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                  }
                }
                uVar36 = uVar32 - 1;
              }
            }
          }
        }
        else {
          iVar35 = 6;
        }
      } while (iVar35 == 0);
      if (iVar35 == 6) {
        auVar78 = ZEXT1664(auVar78._0_16_);
        auVar86 = ZEXT1664(auVar86._0_16_);
        cVar30 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar33 & 0xfffffffffffffff0) * 0x40 + 8))
                           (&pre,ray,context);
        auVar59._8_56_ = extraout_var;
        auVar59._0_8_ = extraout_XMM1_Qa;
        iVar35 = 0;
        if (cVar30 != '\0') {
          ray->tfar = -INFINITY;
          iVar35 = 3;
        }
      }
    } while (iVar35 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }